

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O1

void __thiscall slack::_detail::Slacking::trigger_error(Slacking *this,string *msg)

{
  undefined8 in_RAX;
  ostream *poVar1;
  runtime_error *this_00;
  undefined8 uStack_18;
  
  if (this->throw_exception_ != true) {
    uStack_18 = in_RAX;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[slacking] error. Reason: ",0x1a);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(msg->_M_dataplus)._M_p,msg->_M_string_length);
    uStack_18 = CONCAT17(10,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)msg);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void trigger_error(const std::string& msg) {
        if (throw_exception_) 
            throw std::runtime_error(msg);
        else 
            std::cerr << "[slacking] error. Reason: " << msg << '\n';
    }